

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_File * doOpenWrite(char *_fname,int appending)

{
  code *pcVar1;
  undefined8 uVar2;
  __PHYSFS_DIRHANDLE__ *p_Var3;
  undefined1 *ptr;
  DirHandle *pDVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  PHYSFS_Io *pPVar8;
  void *__s;
  undefined1 **ppuVar9;
  undefined1 *local_58;
  char *local_50;
  PHYSFS_Archiver *f;
  DirHandle *h;
  PHYSFS_Io *io;
  char *fname;
  size_t len;
  FileHandle *fh;
  char *pcStack_18;
  int appending_local;
  char *_fname_local;
  
  ppuVar9 = &local_58;
  len = 0;
  fh._4_4_ = appending;
  pcStack_18 = _fname;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local = (char *)0x0;
  }
  else {
    sVar6 = strlen(_fname);
    pcVar7 = (char *)(sVar6 + 1);
    if (pcVar7 < (char *)0x100) {
      ppuVar9 = (undefined1 **)((long)&local_58 - (sVar6 + 0x18 & 0xfffffffffffffff0));
      local_58 = (undefined1 *)ppuVar9;
    }
    else {
      local_58 = (undefined1 *)0x0;
    }
    ptr = local_58;
    fname = pcVar7;
    *(undefined8 *)((long)ppuVar9 + -8) = 0x10aaf2;
    pPVar8 = (PHYSFS_Io *)__PHYSFS_initSmallAlloc(ptr,(size_t)pcVar7);
    pcVar7 = pcStack_18;
    io = pPVar8;
    if (pPVar8 == (PHYSFS_Io *)0x0) {
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ab07;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      _fname_local = (char *)0x0;
    }
    else {
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ab23;
      iVar5 = sanitizePlatformIndependentPath(pcVar7,(char *)pPVar8);
      if (iVar5 != 0) {
        h = (DirHandle *)0x0;
        f = (PHYSFS_Archiver *)0x0;
        *(undefined8 *)((long)ppuVar9 + -8) = 0x10ab48;
        __PHYSFS_platformGrabMutex(stateLock);
        if (writeDir == (DirHandle *)0x0) {
          *(undefined8 *)((long)ppuVar9 + -8) = 0x10ab5c;
          PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
        }
        else {
          f = (PHYSFS_Archiver *)writeDir;
          *(undefined8 *)((long)ppuVar9 + -8) = 0x10ab7d;
          iVar5 = verifyPath(writeDir,(char **)&io,0);
          if (iVar5 != 0) {
            local_50 = (f->info).author;
            if (fh._4_4_ == 0) {
              pcVar1 = *(code **)(local_50 + 0x48);
              uVar2 = *(undefined8 *)f;
              *(undefined8 *)((long)ppuVar9 + -8) = 0x10abcb;
              h = (DirHandle *)(*pcVar1)(uVar2);
            }
            else {
              pcVar1 = *(code **)(local_50 + 0x50);
              uVar2 = *(undefined8 *)f;
              *(undefined8 *)((long)ppuVar9 + -8) = 0x10abb0;
              h = (DirHandle *)(*pcVar1)(uVar2);
            }
            if (h != (DirHandle *)0x0) {
              *(undefined8 *)((long)ppuVar9 + -8) = 0x10abe7;
              __s = (*__PHYSFS_AllocatorHooks.Malloc)(0x40);
              pDVar4 = h;
              len = (size_t)__s;
              if (__s == (void *)0x0) {
                p_Var3 = h[1].next;
                *(undefined8 *)((long)ppuVar9 + -8) = 0x10ac00;
                (*(code *)p_Var3)(pDVar4);
                *(undefined8 *)((long)ppuVar9 + -8) = 0x10ac0a;
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
              }
              else {
                *(undefined8 *)((long)ppuVar9 + -8) = 0x10ac1c;
                memset(__s,0,0x40);
                *(DirHandle **)len = h;
                *(PHYSFS_Archiver **)(len + 0x10) = f;
                *(FileHandle **)(len + 0x38) = openWriteList;
                openWriteList = (FileHandle *)len;
              }
            }
          }
        }
        *(undefined8 *)((long)ppuVar9 + -8) = 0x10ac5b;
        __PHYSFS_platformReleaseMutex(stateLock);
      }
      pPVar8 = io;
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ac64;
      __PHYSFS_smallFree(pPVar8);
      _fname_local = (char *)len;
    }
  }
  return (PHYSFS_File *)_fname_local;
}

Assistant:

static PHYSFS_File *doOpenWrite(const char *_fname, int appending)
{
    FileHandle *fh = NULL;
    size_t len;
    char *fname;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *h = NULL;
        const PHYSFS_Archiver *f;

        __PHYSFS_platformGrabMutex(stateLock);

        GOTO_IF(!writeDir, PHYSFS_ERR_NO_WRITE_DIR, doOpenWriteEnd);

        h = writeDir;
        GOTO_IF_ERRPASS(!verifyPath(h, &fname, 0), doOpenWriteEnd);

        f = h->funcs;
        if (appending)
            io = f->openAppend(h->opaque, fname);
        else
            io = f->openWrite(h->opaque, fname);

        GOTO_IF_ERRPASS(!io, doOpenWriteEnd);

        fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
        if (fh == NULL)
        {
            io->destroy(io);
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, doOpenWriteEnd);
        } /* if */
        else
        {
            memset(fh, '\0', sizeof (FileHandle));
            fh->io = io;
            fh->dirHandle = h;
            fh->next = openWriteList;
            openWriteList = fh;
        } /* else */

        doOpenWriteEnd:
        __PHYSFS_platformReleaseMutex(stateLock);
    } /* if */

    __PHYSFS_smallFree(fname);
    return ((PHYSFS_File *) fh);
}